

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage3.cpp
# Opt level: O1

void test(bool verbose)

{
  int iVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  Framer framer;
  test_resource tpmr;
  char local_141;
  long *local_140;
  long local_138;
  long local_130 [2];
  Framer local_120;
  test_resource local_118;
  
  Framer::Framer(&local_120,"Stage3",verbose);
  std::pmr::test_resource::test_resource(&local_118,"stage3",verbose);
  local_118.m_no_abort_flag_.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
  puVar2 = (undefined8 *)(**(code **)(local_118._0_8_ + 0x10))(&local_118,8,1);
  *puVar2 = 0x6c6f6f66726162;
  local_140 = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,puVar2,(long)puVar2 + 7);
  iVar1 = std::__cxx11::string::compare((char *)&local_140);
  if (local_140 != local_130) {
    operator_delete(local_140,local_130[0] + 1);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"astring.str()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"barfool\"",9);
    local_140 = (long *)CONCAT71(local_140._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_140,1);
    local_140 = local_130;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,puVar2,(long)puVar2 + 7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_140,local_138);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," != ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"barfool",7);
    local_141 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_141,1);
    if (local_140 != local_130) {
      operator_delete(local_140,local_130[0] + 1);
    }
  }
  (**(code **)(local_118._0_8_ + 0x18))(&local_118,puVar2,7,1);
  std::pmr::test_resource::~test_resource(&local_118);
  Framer::~Framer(&local_120);
  return;
}

Assistant:

void test(bool verbose)
{
    Framer framer{ "Stage3", verbose };

    std::pmr::test_resource tpmr{ "stage3", verbose };
    tpmr.set_no_abort(true);

    pstring astring{ "barfool", &tpmr };

    ASSERT_EQ(astring.str(), "barfool");
}